

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# desugarer.cpp
# Opt level: O3

AST * __thiscall
jsonnet::internal::Desugarer::makeObjectComprehension
          (Desugarer *this,ObjectComprehension *ast,uint obj_level)

{
  LocationRange *args;
  pointer pOVar1;
  pointer pCVar2;
  sockaddr *__addr;
  Desugarer *pDVar3;
  Identifier *id;
  AST *pAVar4;
  Index *pIVar5;
  ObjectComprehensionSimple *pOVar6;
  pointer pCVar7;
  initializer_list<jsonnet::internal::Array::Element> __l;
  bool local_34d;
  int local_34c;
  Identifier *local_348;
  Desugarer *local_340;
  Var *local_338;
  uint local_32c;
  ios_base *local_328;
  void *local_320;
  Local *local_318;
  undefined1 local_310 [32];
  LiteralNumber *local_2f0;
  Binds binds;
  AST *zero;
  Identifier *_arr;
  AST *value;
  SuperVars svs;
  Elements arr_e;
  stringstream num;
  undefined1 local_260 [24];
  vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
  local_248;
  vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
  local_230;
  vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
  local_218 [2];
  _Alloc_hider local_1e8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1d8 [3];
  vector<jsonnet::internal::ArgParam,_std::allocator<jsonnet::internal::ArgParam>_> local_1a8;
  vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
  local_188;
  vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
  local_160 [5];
  AST *arr;
  vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
  local_c0;
  vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
  local_98;
  vector<jsonnet::internal::ArgParam,_std::allocator<jsonnet::internal::ArgParam>_> local_80;
  vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
  local_60;
  vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
  local_48;
  
  local_32c = obj_level;
  if (obj_level == 0) {
    _num = (pointer)(local_260 + 8);
    ::std::__cxx11::u32string::_M_construct<char32_t_const*>((u32string *)&num,L"$",L"");
    id = Allocator::makeIdentifier(this->alloc,(UString *)&num);
    if (_num != (pointer)(local_260 + 8)) {
      operator_delete(_num,local_260._8_8_ * 4 + 4);
    }
    pAVar4 = &Allocator::
              make<jsonnet::internal::Self,jsonnet::internal::LocationRange_const&,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>const&>
                        (this->alloc,(LocationRange *)E,
                         (vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                          *)EF)->super_AST;
    ObjectField::Local((ObjectField *)&num,(Fodder *)EF,(Fodder *)EF,id,(Fodder *)EF,pAVar4,
                       (Fodder *)EF);
    ::std::vector<jsonnet::internal::ObjectField,_std::allocator<jsonnet::internal::ObjectField>_>::
    emplace_back<jsonnet::internal::ObjectField>(&ast->fields,(ObjectField *)&num);
    ::std::
    vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>::
    ~vector(local_160);
    ::std::
    vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>::
    ~vector(&local_188);
    ::std::vector<jsonnet::internal::ArgParam,_std::allocator<jsonnet::internal::ArgParam>_>::
    ~vector(&local_1a8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1e8._M_p != local_1d8) {
      operator_delete(local_1e8._M_p,local_1d8[0]._M_allocated_capacity + 1);
    }
    ::std::
    vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>::
    ~vector(local_218);
    ::std::
    vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>::
    ~vector(&local_230);
    ::std::
    vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>::
    ~vector(&local_248);
    ::std::
    vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>::
    ~vector((vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
             *)local_260);
    desugarFields(&svs,this,&ast->super_AST,&ast->fields,0);
  }
  else {
    desugarFields(&svs,this,&ast->super_AST,&ast->fields,obj_level);
  }
  pOVar1 = (ast->fields).
           super__Vector_base<jsonnet::internal::ObjectField,_std::allocator<jsonnet::internal::ObjectField>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pAVar4 = pOVar1->expr1;
  value = pOVar1->expr2;
  _num = (pointer)(local_260 + 8);
  ::std::__cxx11::u32string::_M_construct<char32_t_const*>((u32string *)&num,L"$arr",L"");
  local_348 = Allocator::makeIdentifier(this->alloc,(UString *)&num);
  if (_num != (pointer)(local_260 + 8)) {
    operator_delete(_num,local_260._8_8_ * 4 + 4);
  }
  _arr = local_348;
  zero = &Allocator::
          make<jsonnet::internal::LiteralNumber,jsonnet::internal::LocationRange_const&,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>const&,char_const(&)[4]>
                    (this->alloc,(LocationRange *)E,
                     (vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                      *)EF,(char (*) [4])"0.0")->super_AST;
  binds.
  super__Vector_base<jsonnet::internal::Local::Bind,_std::allocator<jsonnet::internal::Local::Bind>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  binds.
  super__Vector_base<jsonnet::internal::Local::Bind,_std::allocator<jsonnet::internal::Local::Bind>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  binds.
  super__Vector_base<jsonnet::internal::Local::Bind,_std::allocator<jsonnet::internal::Local::Bind>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  _num = (pointer)pAVar4;
  ::std::vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
  ::vector((vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
            *)local_260,
           (vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
            *)EF);
  __l._M_len = 1;
  __l._M_array = (iterator)&num;
  ::std::
  vector<jsonnet::internal::Array::Element,_std::allocator<jsonnet::internal::Array::Element>_>::
  vector(&arr_e,__l,(allocator_type *)&arr);
  ::std::vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
  ::~vector((vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
             *)local_260);
  pCVar7 = (ast->specs).
           super__Vector_base<jsonnet::internal::ComprehensionSpec,_std::allocator<jsonnet::internal::ComprehensionSpec>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pCVar2 = (ast->specs).
           super__Vector_base<jsonnet::internal::ComprehensionSpec,_std::allocator<jsonnet::internal::ComprehensionSpec>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (pCVar7 != pCVar2) {
    local_328 = (ios_base *)&local_1e8;
    local_34c = 1;
    local_340 = this;
    do {
      if (pCVar7->kind == FOR) {
        ::std::__cxx11::stringstream::stringstream((stringstream *)&num);
        ::std::ostream::operator<<(local_260 + 8,local_34c);
        __addr = (sockaddr *)pCVar7->var;
        local_310._0_8_ = local_348;
        local_338 = Allocator::
                    make<jsonnet::internal::Var,jsonnet::internal::LocationRange_const&,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>const&,jsonnet::internal::Identifier_const*&>
                              (local_340->alloc,(LocationRange *)E,
                               (vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                                *)EF,(Identifier **)local_310);
        local_34d = false;
        ::std::__cxx11::stringbuf::str();
        pDVar3 = local_340;
        local_2f0 = Allocator::
                    make<jsonnet::internal::LiteralNumber,jsonnet::internal::LocationRange_const&,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>const&,std::__cxx11::string>
                              (local_340->alloc,(LocationRange *)E,
                               (vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                                *)EF,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)local_310);
        local_318 = (Local *)0x0;
        local_320 = (void *)0x0;
        pIVar5 = Allocator::
                 make<jsonnet::internal::Index,jsonnet::internal::LocationRange_const&,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>const&,jsonnet::internal::Var*,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>const&,bool,jsonnet::internal::LiteralNumber*,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>const&,decltype(nullptr),std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>const&,decltype(nullptr),std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>const&>
                           (pDVar3->alloc,(LocationRange *)E,
                            (vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                             *)EF,&local_338,
                            (vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                             *)EF,&local_34d,&local_2f0,
                            (vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                             *)EF,&local_318,
                            (vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                             *)EF,&local_320,
                            (vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                             *)EF);
        bind((Desugarer *)&arr,(int)pDVar3,__addr,(socklen_t)pIVar5);
        ::std::
        vector<jsonnet::internal::Local::Bind,_std::allocator<jsonnet::internal::Local::Bind>_>::
        emplace_back<jsonnet::internal::Local::Bind>(&binds,(Bind *)&arr);
        ::std::
        vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
        ::~vector(&local_48);
        ::std::
        vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
        ::~vector(&local_60);
        ::std::vector<jsonnet::internal::ArgParam,_std::allocator<jsonnet::internal::ArgParam>_>::
        ~vector(&local_80);
        ::std::
        vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
        ::~vector(&local_98);
        ::std::
        vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
        ::~vector(&local_c0);
        ::std::
        vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
        ::~vector((vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                   *)&arr);
        this = local_340;
        if ((Identifier *)local_310._0_8_ != (Identifier *)(local_310 + 0x10)) {
          operator_delete((void *)local_310._0_8_,local_310._16_8_ + 1);
        }
        arr = (AST *)pCVar7->var;
        local_310._0_8_ =
             Allocator::
             make<jsonnet::internal::Var,jsonnet::internal::LocationRange_const&,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>const&,jsonnet::internal::Identifier_const*&>
                       (this->alloc,(LocationRange *)E,
                        (vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                         *)EF,(Identifier **)&arr);
        ::std::
        vector<jsonnet::internal::Array::Element,std::allocator<jsonnet::internal::Array::Element>>
        ::
        emplace_back<jsonnet::internal::Var*,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>const&>
                  ((vector<jsonnet::internal::Array::Element,std::allocator<jsonnet::internal::Array::Element>>
                    *)&arr_e,(Var **)local_310,
                   (vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                    *)EF);
        local_34c = local_34c + 1;
        ::std::__cxx11::stringstream::~stringstream((stringstream *)&num);
        ::std::ios_base::~ios_base(local_328);
      }
      pCVar7 = pCVar7 + 1;
    } while (pCVar7 != pCVar2);
  }
  args = &(ast->super_AST).location;
  local_310._0_8_ = local_310._0_8_ & 0xffffffffffffff00;
  _num = (pointer)Allocator::
                  make<jsonnet::internal::Array,jsonnet::internal::LocationRange&,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>const&,std::vector<jsonnet::internal::Array::Element,std::allocator<jsonnet::internal::Array::Element>>&,bool,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>const&>
                            (this->alloc,args,
                             (vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                              *)EF,&arr_e,(bool *)local_310,
                             (vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                              *)EF);
  local_338 = (Var *)((ulong)local_338 & 0xffffffffffffff00);
  arr = &Allocator::
         make<jsonnet::internal::ArrayComprehension,jsonnet::internal::LocationRange&,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>const&,jsonnet::internal::Array*,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>const&,bool,std::vector<jsonnet::internal::ComprehensionSpec,std::allocator<jsonnet::internal::ComprehensionSpec>>&,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>const&>
                   (this->alloc,args,
                    (vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                     *)EF,(Array **)&num,
                    (vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                     *)EF,(bool *)&local_338,&ast->specs,
                    (vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                     *)EF)->super_AST;
  desugar(this,&arr,local_32c);
  _num = (pointer)local_348;
  local_338 = Allocator::
              make<jsonnet::internal::Var,jsonnet::internal::LocationRange_const&,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>const&,jsonnet::internal::Identifier_const*&>
                        (this->alloc,(LocationRange *)E,
                         (vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                          *)EF,(Identifier **)&num);
  local_320 = (void *)((ulong)local_320 & 0xffffffffffffff00);
  _num = (pointer)0x0;
  local_2f0 = (LiteralNumber *)0x0;
  local_310._0_8_ =
       Allocator::
       make<jsonnet::internal::Index,jsonnet::internal::LocationRange_const&,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>const&,jsonnet::internal::Var*,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>const&,bool,jsonnet::internal::AST*&,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>const&,decltype(nullptr),std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>const&,decltype(nullptr),std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>const&>
                 (this->alloc,(LocationRange *)E,
                  (vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                   *)EF,&local_338,
                  (vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                   *)EF,(bool *)&local_320,&zero,
                  (vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                   *)EF,(void **)&num,
                  (vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                   *)EF,&local_2f0,
                  (vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                   *)EF);
  local_318 = Allocator::
              make<jsonnet::internal::Local,jsonnet::internal::LocationRange&,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>const&,std::vector<jsonnet::internal::Local::Bind,std::allocator<jsonnet::internal::Local::Bind>>&,jsonnet::internal::AST*&>
                        (this->alloc,args,
                         (vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                          *)EF,&binds,&value);
  pOVar6 = Allocator::
           make<jsonnet::internal::ObjectComprehensionSimple,jsonnet::internal::LocationRange&,jsonnet::internal::Index*,jsonnet::internal::Local*,jsonnet::internal::Identifier_const*&,jsonnet::internal::AST*&>
                     (this->alloc,args,(Index **)local_310,&local_318,&_arr,&arr);
  ::std::
  vector<jsonnet::internal::Array::Element,_std::allocator<jsonnet::internal::Array::Element>_>::
  ~vector(&arr_e);
  ::std::vector<jsonnet::internal::Local::Bind,_std::allocator<jsonnet::internal::Local::Bind>_>::
  ~vector(&binds);
  if (svs.
      super__Vector_base<std::pair<const_jsonnet::internal::Identifier_*,_jsonnet::internal::AST_*>,_std::allocator<std::pair<const_jsonnet::internal::Identifier_*,_jsonnet::internal::AST_*>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(svs.
                    super__Vector_base<std::pair<const_jsonnet::internal::Identifier_*,_jsonnet::internal::AST_*>,_std::allocator<std::pair<const_jsonnet::internal::Identifier_*,_jsonnet::internal::AST_*>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)svs.
                          super__Vector_base<std::pair<const_jsonnet::internal::Identifier_*,_jsonnet::internal::AST_*>,_std::allocator<std::pair<const_jsonnet::internal::Identifier_*,_jsonnet::internal::AST_*>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)svs.
                          super__Vector_base<std::pair<const_jsonnet::internal::Identifier_*,_jsonnet::internal::AST_*>,_std::allocator<std::pair<const_jsonnet::internal::Identifier_*,_jsonnet::internal::AST_*>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return &pOVar6->super_AST;
}

Assistant:

AST* makeObjectComprehension(ObjectComprehension *ast, unsigned obj_level) {
        // Hidden variable to allow outer/top binding.
        if (obj_level == 0) {
            const Identifier *hidden_var = id(U"$");
            auto *body = make<Self>(E, EF);
            ast->fields.push_back(ObjectField::Local(EF, EF, hidden_var, EF, body, EF));
        }

        SuperVars svs = desugarFields(ast, ast->fields, obj_level);

        AST *field = ast->fields.front().expr1;
        AST *value = ast->fields.front().expr2;

        /*  {
            [arr[0]]: local x = arr[1], y = arr[2], z = arr[3]; val_expr
            for arr in [ [key_expr, x, y, z] for ...  ]
            }
        */
        auto *_arr = id(U"$arr");
        AST *zero = make<LiteralNumber>(E, EF, "0.0");
        int counter = 1;
        Local::Binds binds;
        Array::Elements arr_e{Array::Element(field, EF)};
        for (ComprehensionSpec &spec : ast->specs) {
            if (spec.kind == ComprehensionSpec::FOR) {
                std::stringstream num;
                num << counter++;
                binds.push_back(bind(spec.var,
                                     make<Index>(E,
                                                 EF,
                                                 var(_arr),
                                                 EF,
                                                 false,
                                                 make<LiteralNumber>(E, EF, num.str()),
                                                 EF,
                                                 nullptr,
                                                 EF,
                                                 nullptr,
                                                 EF)));
                arr_e.emplace_back(var(spec.var), EF);
            }
        }
        AST *arr = make<ArrayComprehension>(ast->location,
                                            EF,
                                            make<Array>(ast->location, EF, arr_e, false, EF),
                                            EF,
                                            false,
                                            ast->specs,
                                            EF);
        desugar(arr, obj_level);
        return make<ObjectComprehensionSimple>(
            ast->location,
            make<Index>(E, EF, var(_arr), EF, false, zero, EF, nullptr, EF, nullptr, EF),
            make<Local>(ast->location, EF, binds, value),
            _arr,
            arr);
    }